

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O3

int __thiscall TPZCheckMesh::CheckConnectOrderConsistency(TPZCheckMesh *this)

{
  int64_t iVar1;
  int nstate;
  int iVar2;
  int iVar3;
  TPZCompEl **ppTVar4;
  long *plVar5;
  TPZConnect *this_00;
  uint uVar6;
  int iVar7;
  ulong nelem;
  
  iVar1 = (this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  nstate = (**(code **)(*(long *)(this->fMesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_left[1]._M_parent + 0x78))();
  uVar6 = (uint)iVar1;
  if (0 < (int)uVar6) {
    nelem = 0;
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if (*ppTVar4 != (TPZCompEl *)0x0) {
        plVar5 = (long *)__dynamic_cast(*ppTVar4,&TPZCompEl::typeinfo,
                                        &TPZInterpolatedElement::typeinfo,0);
        iVar2 = (**(code **)(*plVar5 + 0x380))(plVar5);
        if (iVar2 == 0) {
LAB_010d1719:
          (**(code **)(*plVar5 + 200))(plVar5,&std::cout);
          return (int)nelem;
        }
        iVar2 = (**(code **)(*plVar5 + 0x90))(plVar5);
        if (0 < iVar2) {
          iVar7 = 0;
          do {
            this_00 = (TPZConnect *)(**(code **)(*plVar5 + 0xa8))(plVar5,iVar7);
            iVar3 = (**(code **)(*plVar5 + 0x260))(plVar5,iVar7,(this_00->field_2).fCompose.fOrder);
            iVar3 = TPZConnect::CheckDependency(this_00,iVar3,this->fMesh,nstate);
            if (iVar3 == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"TPZCheckMesh inconsistent dependency",0x24);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              std::ostream::put(-0x58);
              std::ostream::flush();
              goto LAB_010d1719;
            }
            iVar7 = iVar7 + 1;
          } while (iVar2 != iVar7);
        }
      }
      nelem = nelem + 1;
    } while (nelem != (uVar6 & 0x7fffffff));
  }
  return -1;
}

Assistant:

int TPZCheckMesh::CheckConnectOrderConsistency() {
	
	int nel = fMesh->ElementVec().NElements();
	int nstate = (fMesh->MaterialVec().begin()->second)->NStateVariables();
	int iel;
	for(iel = 0; iel<nel; iel++) {
		TPZCompEl *cel = fMesh->ElementVec()[iel];
		if(!cel) continue;
		TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
		if(!intel->CheckElementConsistency()) {
			intel->Print();
			return iel;
		}
		int nc = intel->NConnects();
		int ic;
		for(ic = 0; ic<nc; ic++) {
			TPZConnect &c = intel->Connect(ic);
			int nshape = intel->NConnectShapeF(ic,c.Order());
			if(c.CheckDependency(nshape, fMesh, nstate) == -1) {
				cout << "TPZCheckMesh inconsistent dependency" << endl;
				intel->Print();
				return iel;
			}
		}
	}
	return -1;
}